

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

void __thiscall OpenMD::ifstrstream::~ifstrstream(ifstrstream *this,void **vtt)

{
  undefined8 *in_RSI;
  ifstrstream *in_RDI;
  
  (in_RDI->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)*in_RSI;
  *(undefined8 *)
   ((long)&(in_RDI->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
   (long)(in_RDI->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3]) =
       in_RSI[3];
  close(in_RDI,(int)in_RSI);
  std::filebuf::~filebuf
            ((filebuf *)&(in_RDI->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  std::__cxx11::stringbuf::~stringbuf
            ((basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::istream::~istream(in_RDI);
  return;
}

Assistant:

ifstrstream::~ifstrstream() { close(); }